

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint kj::hashCode<capnp::_::RawBrandedSchema_const*const&,unsigned_char_const&>
               (RawBrandedSchema **values,uchar *values_1)

{
  uint uVar1;
  RawBrandedSchema **value;
  uchar *value_00;
  ArrayPtr<unsigned_int> local_40;
  ArrayPtr<unsigned_char> local_30;
  uint local_20;
  uint local_1c;
  uint hashes [2];
  uchar *values_local_1;
  RawBrandedSchema **values_local;
  
  hashes = (uint  [2])values_1;
  value = fwd<capnp::_::RawBrandedSchema_const*const&>(values);
  local_20 = hashCode<capnp::_::RawBrandedSchema_const*const&>(value);
  value_00 = fwd<unsigned_char_const&>((uchar *)hashes);
  local_1c = hashCode<unsigned_char_const&>(value_00);
  ArrayPtr<unsigned_int>::ArrayPtr<2ul>(&local_40,(uint (*) [2])&local_20);
  local_30 = ArrayPtr<unsigned_int>::asBytes(&local_40);
  uVar1 = hashCode<kj::ArrayPtr<unsigned_char>>(&local_30);
  return uVar1;
}

Assistant:

inline uint hashCode(T&&... values) {
  uint hashes[] = { hashCode(kj::fwd<T>(values))... };
  return hashCode(kj::ArrayPtr<uint>(hashes).asBytes());
}